

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void __thiscall mocker::DuplicatedSymbols::~DuplicatedSymbols(DuplicatedSymbols *this)

{
  ~DuplicatedSymbols(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

DuplicatedSymbols(const Position &beg, const Position &end,
                    const std::string &symName)
      : CompileError(beg, end) {
    msg = std::string(CompileError::what()) + ". Symbol: " + symName;
  }